

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O3

void __thiscall
m2d::savanna::ssl_reuse::
https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::on_connect_l(https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
               *this,error_code ec,endpoint_type *type)

{
  element_type *peVar1;
  iterator iVar2;
  bool bVar3;
  address local_68;
  string local_40;
  _Head_base<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_false>
  local_20;
  
  bVar3 = (type->impl_).data_.base.sa_family != 2;
  if (bVar3) {
    local_68.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)((long)&(type->impl_).data_ + 8);
    local_68.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)((long)&(type->impl_).data_ + 0x10);
    local_68.ipv6_address_.scope_id_ = (unsigned_long)(type->impl_).data_.v6.sin6_scope_id;
    local_68.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
  }
  else {
    local_68.ipv4_address_.addr_.s_addr = (in4_addr_type)(type->impl_).data_.v6.sin6_flowinfo;
    local_68.ipv6_address_.addr_.__in6_u._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
    ;
    local_68.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_68.ipv6_address_.scope_id_ = 0;
  }
  local_68.type_ = (uint)bVar3;
  boost::asio::ip::address::to_string_abi_cxx11_(&local_40,&local_68);
  std::__cxx11::string::operator=((string *)&this->ipaddress_,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (&this->ssl_cache_->_M_t !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
       *)0x0) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
            ::find(&this->ssl_cache_->_M_t,&this->ipaddress_);
    if ((_Rb_tree_header *)iVar2._M_node != &(this->ssl_cache_->_M_t)._M_impl.super__Rb_tree_header)
    {
      SSL_set_session(*(SSL **)((long)(((this->ssl_stream_).
                                        super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->p_)._M_t.
                                      super___uniq_ptr_impl<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                               + 0x10),*(SSL_SESSION **)(iVar2._M_node + 2));
    }
  }
  peVar1 = (this->ssl_stream_).
           super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_ptr<m2d::savanna::ssl_reuse::interface,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<m2d::savanna::ssl_reuse::interface,void>
            ((__shared_ptr<m2d::savanna::ssl_reuse::interface,(__gnu_cxx::_Lock_policy)2> *)
             &local_68,
             (__weak_ptr<m2d::savanna::ssl_reuse::interface,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_interface).
              super_enable_shared_from_this<m2d::savanna::ssl_reuse::interface>);
  local_40._M_dataplus._M_p = (pointer)ssl_reuse::interface::on_handshake;
  local_40._M_string_length = 0;
  local_40.field_2._M_allocated_capacity._0_4_ = local_68.type_;
  local_40.field_2._M_allocated_capacity._4_4_ = local_68.ipv4_address_.addr_.s_addr;
  local_40.field_2._8_8_ = local_68.ipv6_address_.addr_.__in6_u._0_8_;
  local_68.type_ = ipv4;
  local_68.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  local_68.ipv6_address_.addr_.__in6_u._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_20._M_head_impl =
       *(flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
         **)&(peVar1->p_)._M_t.
             super___uniq_ptr_impl<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
  ;
  boost::asio::ssl::
  stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>
  ::initiate_async_handshake::operator()
            (&local_20,
             (bind_front_wrapper<void_(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code),_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>
              *)&local_40,client);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.field_2._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.ipv6_address_.addr_.__in6_u._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.ipv6_address_.addr_.__in6_u._0_8_);
  }
  return;
}

Assistant:

void on_connect_l(beast::error_code ec, tcp::resolver::results_type::endpoint_type type) override {
			// add session to the cache after a successful connection
			ipaddress_ = type.address().to_string();
			if(ssl_cache_) {
				auto cached_session = ssl_cache_->find(ipaddress_);
				if (cached_session != ssl_cache_->end()) {
					SSL_set_session(ssl_stream_->native_handle(), cached_session->second.get());
				}
			}

			ssl_stream_->async_handshake(
				ssl::stream_base::client,
				beast::bind_front_handler(
					&https_logic<Body>::on_handshake,
					this->shared_from_this()));
		}